

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::StandardNumericToDecimalCast<unsigned_short,_short,_duckdb::UnsignedToDecimalOperator>
               (unsigned_short input,short *result,CastParameters *parameters,uint8_t width,
               uint8_t scale)

{
  bool bVar1;
  short sVar2;
  byte in_CL;
  short *in_RSI;
  unsigned_short in_DI;
  byte in_R8B;
  string error;
  short max_width;
  CastParameters *in_stack_ffffffffffffff78;
  string *error_message;
  string *in_stack_ffffffffffffff88;
  undefined1 auStack_61 [33];
  string asStack_40 [36];
  short sStack_1c;
  byte bStack_1a;
  short *psStack_10;
  unsigned_short uStack_4;
  byte bStack_1;
  
  bStack_1a = in_R8B;
  psStack_10 = in_RSI;
  uStack_4 = in_DI;
  sStack_1c = UnsafeNumericCast<short,_long,_void>
                        (*(long *)(NumericHelper::POWERS_OF_TEN +
                                  (long)(int)((uint)in_CL - (uint)in_R8B) * 8));
  bVar1 = UnsignedToDecimalOperator::Operation<unsigned_short,_short>(uStack_4,sStack_1c);
  if (bVar1) {
    error_message = (string *)auStack_61;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(auStack_61 + 1),"Could not cast value %d to DECIMAL(%d,%d)",
               (allocator *)error_message);
    StringUtil::Format<unsigned_short,_unsigned_char,_unsigned_char>
              (in_stack_ffffffffffffff88,(unsigned_short)((ulong)error_message >> 0x30),
               (uchar)((ulong)error_message >> 0x28),(uchar)((ulong)error_message >> 0x20));
    ::std::__cxx11::string::~string((string *)(auStack_61 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)auStack_61);
    HandleCastError::AssignError(error_message,in_stack_ffffffffffffff78);
    bStack_1 = 0;
    ::std::__cxx11::string::~string(asStack_40);
  }
  else {
    sVar2 = UnsafeNumericCast<short,_long,_void>
                      ((long)(short)uStack_4 *
                       *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)bStack_1a * 8));
    *psStack_10 = sVar2;
    bStack_1 = 1;
  }
  return (bool)(bStack_1 & 1);
}

Assistant:

bool StandardNumericToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	DST max_width = UnsafeNumericCast<DST>(NumericHelper::POWERS_OF_TEN[width - scale]);
	if (OP::template Operation<SRC, DST>(input, max_width)) {
		string error = StringUtil::Format("Could not cast value %d to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = UnsafeNumericCast<DST>(DST(input) * NumericHelper::POWERS_OF_TEN[scale]);
	return true;
}